

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O1

bool __thiscall cplus::utils::List<int_*>::append(List<int_*> *this,int **value)

{
  cplus_list_size_t cVar1;
  ListPoint *pLVar2;
  ListPoint *pLVar3;
  ListPoint *pLVar4;
  
  if (this->state == (ListPoint *)0x0) {
    pLVar4 = (ListPoint *)operator_new(0x10);
    pLVar2 = this->listBegin;
    pLVar3 = this->listEnd;
    pLVar4->value = *value;
    pLVar4->nextAndPrev = (ListPoint *)((ulong)pLVar2 ^ (ulong)pLVar3);
    if (pLVar2 != (ListPoint *)0x0) {
      pLVar2->nextAndPrev =
           (ListPoint *)((ulong)pLVar2->nextAndPrev ^ (ulong)pLVar4 ^ (ulong)pLVar3);
    }
    if (pLVar3 != (ListPoint *)0x0) {
      pLVar3->nextAndPrev =
           (ListPoint *)((ulong)pLVar3->nextAndPrev ^ (ulong)pLVar4 ^ (ulong)pLVar2);
    }
    this->state = pLVar4;
    this->preview = pLVar4;
    this->listBegin = pLVar4;
    this->listEnd = pLVar4;
  }
  else {
    cVar1 = this->listSize;
    if (cVar1 == this->maxSize) {
      return false;
    }
    pLVar4 = (ListPoint *)operator_new(0x10);
    pLVar2 = this->listBegin;
    pLVar3 = this->listEnd;
    pLVar4->value = *value;
    pLVar4->nextAndPrev = (ListPoint *)((ulong)pLVar2 ^ (ulong)pLVar3);
    if (pLVar2 != (ListPoint *)0x0) {
      pLVar2->nextAndPrev =
           (ListPoint *)((ulong)pLVar2->nextAndPrev ^ (ulong)pLVar4 ^ (ulong)pLVar3);
    }
    if (pLVar3 != (ListPoint *)0x0) {
      pLVar3->nextAndPrev =
           (ListPoint *)((ulong)pLVar3->nextAndPrev ^ (ulong)pLVar4 ^ (ulong)pLVar2);
    }
    this->listEnd = pLVar4;
    this->listSize = cVar1 + 1;
  }
  return true;
}

Assistant:

bool append(const T &value) {
				if (state == nullptr) {
					state = new ListPoint(listEnd, listBegin, value);
					listEnd = listBegin = preview = state;
				} else if (listSize != maxSize) {
					listEnd = new ListPoint(listEnd, listBegin, value);
					++listSize;
				} else {
					return false;
				}
				return true;
			}